

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O1

void google::protobuf::StringReplace
               (string *s,string *oldsub,string *newsub,bool replace_all,string *res)

{
  long lVar1;
  ulong uVar2;
  
  if (oldsub->_M_string_length == 0) {
    std::__cxx11::string::_M_append((char *)res,(ulong)(s->_M_dataplus)._M_p);
    return;
  }
  uVar2 = 0;
  do {
    lVar1 = std::__cxx11::string::find((char *)s,(ulong)(oldsub->_M_dataplus)._M_p,uVar2);
    if (lVar1 == -1) break;
    std::__cxx11::string::append((string *)res,(ulong)s,uVar2);
    std::__cxx11::string::_M_append((char *)res,(ulong)(newsub->_M_dataplus)._M_p);
    uVar2 = oldsub->_M_string_length + lVar1;
  } while (replace_all);
  std::__cxx11::string::append((string *)res,(ulong)s,uVar2);
  return;
}

Assistant:

void StringReplace(const string& s, const string& oldsub,
                   const string& newsub, bool replace_all,
                   string* res) {
  if (oldsub.empty()) {
    res->append(s);  // if empty, append the given string.
    return;
  }

  string::size_type start_pos = 0;
  string::size_type pos;
  do {
    pos = s.find(oldsub, start_pos);
    if (pos == string::npos) {
      break;
    }
    res->append(s, start_pos, pos - start_pos);
    res->append(newsub);
    start_pos = pos + oldsub.size();  // start searching again after the "old"
  } while (replace_all);
  res->append(s, start_pos, s.length() - start_pos);
}